

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Inline_Map_AST_Node::eval_internal(Inline_Map_AST_Node *this,Dispatch_State *t_ss)

{
  long lVar1;
  long *plVar2;
  string *t_name;
  Dispatch_Engine *this_00;
  File_Position this_01;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  File_Position *pFVar7;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar8;
  Boxed_Value BVar9;
  initializer_list<chaiscript::Boxed_Value> __l;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  retval;
  allocator_type local_e9;
  undefined1 local_e8 [24];
  Result_Type local_d0;
  undefined8 local_b0;
  Boxed_Value local_a8;
  undefined1 local_98 [40];
  __native_type local_70;
  element_type *local_40;
  
  local_70._16_8_ = &local_70;
  local_70.__data.__lock = 0;
  local_70._8_8_ = 0;
  local_70.__data.__list.__next = (__pthread_internal_list *)0x0;
  lVar1 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
  plVar8 = *(long **)(lVar1 + 0x60);
  plVar2 = *(long **)(lVar1 + 0x68);
  local_b0 = t_ss;
  local_98._16_8_ = this;
  local_70.__data.__list.__prev = (__pthread_internal_list *)local_70._16_8_;
  if (plVar8 != plVar2) {
    local_b0 = &t_ss[4].m_stack_holder;
    local_98._24_8_ = in_RDX + 2;
    do {
      AST_Node::eval((AST_Node *)local_e8,*(Dispatch_State **)(*(long *)(*plVar8 + 0x60) + 0x10));
      if (*(char *)(local_e8._0_8_ + 0x39) == '\0') {
        t_name = (string *)*in_RDX;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"clone","");
        local_a8.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_e8._0_8_;
        local_a8.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
        if ((File_Position)local_e8._8_8_ != (File_Position)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)(local_e8._8_8_ + 8))->
                     _M_weak_this).
                     super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)(local_e8._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)(local_e8._8_8_ + 8))->
                     _M_weak_this).
                     super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(((enable_shared_from_this<chaiscript::AST_Node> *)(local_e8._8_8_ + 8))->
                          _M_weak_this).
                          super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 1;
          }
        }
        __l._M_len = 1;
        __l._M_array = &local_a8;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   &stack0xffffffffffffffb8,__l,&local_e9);
        chaiscript::detail::Dispatch_Engine::call_function
                  ((Dispatch_Engine *)local_98,t_name,(atomic_uint_fast32_t *)&local_d0,
                   (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   local_b0,(Type_Conversions_State *)&stack0xffffffffffffffb8);
        uVar4 = local_98._8_8_;
        local_e8._0_8_ = local_98._0_8_;
        uVar3 = local_e8._8_8_;
        local_98._0_4_ = 0;
        local_98._4_4_ = 0;
        local_98._8_4_ = 0;
        local_98._12_4_ = 0;
        local_e8._8_8_ = uVar4;
        if ((File_Position)uVar3 != (File_Position)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          if ((File_Position)local_98._8_8_ != (File_Position)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
          }
        }
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   &stack0xffffffffffffffb8);
        if ((File_Position)
            local_a8.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (File_Position)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      this_00 = (Dispatch_Engine *)*in_RDX;
      AST_Node::eval((AST_Node *)&stack0xffffffffffffffb8,
                     (Dispatch_State *)**(undefined8 **)(*plVar8 + 0x60));
      chaiscript::detail::Dispatch_Engine::boxed_cast<std::__cxx11::string>
                (&local_d0,this_00,(Boxed_Value *)&stack0xffffffffffffffb8);
      pFVar7 = (File_Position *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                             *)(local_98 + 0x20),&local_d0);
      uVar5 = local_e8._8_8_;
      uVar3 = local_e8._0_8_;
      local_e8._0_4_ = 0;
      local_e8._4_4_ = 0;
      uVar4 = local_e8._0_8_;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      uVar6 = local_e8._8_8_;
      this_01 = pFVar7[1];
      local_e8._0_4_ = (undefined4)uVar3;
      local_e8._4_4_ = SUB84(uVar3,4);
      pFVar7->line = local_e8._0_4_;
      pFVar7->column = local_e8._4_4_;
      local_e8._8_4_ = (undefined4)uVar5;
      local_e8._12_4_ = SUB84(uVar5,4);
      pFVar7[1].line = local_e8._8_4_;
      pFVar7[1].column = local_e8._12_4_;
      local_e8._0_8_ = uVar4;
      local_e8._8_8_ = uVar6;
      if (this_01 != (File_Position)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_40 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
      }
      if ((File_Position)local_e8._8_8_ != (File_Position)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      plVar8 = plVar8 + 2;
    } while (plVar8 != plVar2);
  }
  uVar3 = local_98._16_8_;
  chaiscript::detail::
  const_var_impl<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((detail *)local_98._16_8_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
              *)(local_98 + 0x20));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
               *)(local_98 + 0x20));
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar3;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          try {
            std::map<std::string, Boxed_Value> retval;

            for (const auto &child : children[0]->children) {
              auto obj = child->children[1]->eval(t_ss);
              if (!obj.is_return_value()) {
                obj = t_ss->call_function("clone", m_loc, {obj}, t_ss.conversions());
              }

              retval[t_ss->boxed_cast<std::string>(child->children[0]->eval(t_ss))] = std::move(obj);
            }

            return const_var(std::move(retval));
          }
          catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Can not find appropriate copy constructor or 'clone' while inserting into Map.", e.parameters, e.functions, false, *t_ss);
          }
        }